

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cc
# Opt level: O1

int __thiscall Edge::binarySearch(Edge *this,pair<int,_int> range,double angle)

{
  iterator *this_00;
  double dVar1;
  reference pMVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int range_min;
  uint local_48;
  uint local_44;
  double local_40;
  uint local_38;
  uint local_34;
  
  uVar7 = (ulong)range >> 0x20;
  uVar8 = range.first;
  uVar5 = (int)(uVar8 + range.second) / 2;
  local_48 = uVar8;
  local_44 = uVar5;
  local_40 = angle;
  std::
  deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::_M_range_check(&this->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ,(long)(int)uVar8);
  this_00 = &(this->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  pMVar2 = std::
           _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
           ::operator[](this_00,(long)(int)uVar8);
  uVar6 = 0xffffffff;
  if ((pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
      [2] + -1e-07 <= local_40) {
    std::
    deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::_M_range_check(&this->
                      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ,(long)range >> 0x20);
    pMVar2 = std::
             _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
             ::operator[](this_00,(long)range >> 0x20);
    uVar6 = 0xfffffffe;
    if (local_40 <=
        (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[2] + 1e-07) {
      local_38 = 1;
      if (1 < (int)uVar8) {
        local_38 = uVar8;
      }
      local_34 = local_38;
      std::
      deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::_M_range_check(&this->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ,(long)(int)uVar5);
      pMVar2 = std::
               _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
               ::operator[](this_00,(long)(int)uVar5);
      puVar4 = &local_48;
      uVar6 = local_44;
      uVar5 = local_48;
      uVar8 = local_48;
      if ((int)local_48 < range.second) {
        do {
          dVar1 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[2];
          if (dVar1 + -1e-07 <= local_40) {
            if (local_40 <= dVar1 + 1e-07) {
              puVar4 = &local_44;
              uVar8 = uVar6;
              break;
            }
            uVar5 = uVar6 + 1;
          }
          else {
            uVar7 = (ulong)uVar6;
          }
          uVar6 = (int)(uVar5 + (int)uVar7) / 2;
          std::
          deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::_M_range_check(&this->
                            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ,(long)(int)uVar6);
          pMVar2 = std::
                   _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                   ::operator[](this_00,(long)(int)uVar6);
          puVar4 = &local_48;
          uVar8 = uVar5;
        } while ((int)uVar5 < (int)uVar7);
      }
      local_48 = uVar5;
      local_44 = uVar6;
      puVar3 = &local_34;
      if ((int)local_38 < (int)uVar8) {
        puVar3 = puVar4;
      }
      uVar6 = *puVar3;
    }
  }
  return uVar6;
}

Assistant:

int Edge::binarySearch(std::pair<int, int> range, double angle) const{
    int s = range.first, e = range.second, m = static_cast<int>((s + e) / 2);
    if (angle < at(s).z() - bs_margin) return -1;
    else if (angle > at(e).z() + bs_margin) return -2;
    int range_min = std::max(1, range.first);
    double mid_angle = at(m).z();
    while (s < e) {
        if (mid_angle - bs_margin > angle) {
            e = m;
        } else if (mid_angle + bs_margin < angle) {
            s = m + 1;
        } else {
            return std::max(range_min, m);
        }
        m = static_cast<int>((s + e) / 2);
        mid_angle = at(m).z();
    } 
    return std::max(range_min, s);
}